

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::_get_permute_axes<unsigned_int>
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_int> *this,char *permut,
          uint *param_2)

{
  char cVar1;
  long lVar2;
  uint *puVar3;
  CImgArgumentException *this_00;
  long lVar4;
  uint uVar5;
  char cVar6;
  long lVar7;
  uint *puVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  uint *puVar15;
  long lVar16;
  bool bVar17;
  CImg<unsigned_int> res;
  
  puVar15 = this->_data;
  bVar17 = true;
  if ((this->_depth != 0 && this->_height != 0) && (this->_width != 0 && puVar15 != (uint *)0x0)) {
    bVar17 = this->_spectrum == 0;
  }
  if ((permut == (char *)0x0) || (bVar17)) {
    CImg(__return_storage_ptr__,this,false);
    return __return_storage_ptr__;
  }
  res._data = (uint *)0x0;
  res._width = 0;
  res._height = 0;
  res._depth = 0;
  res._spectrum = 0;
  res._is_shared = false;
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar6 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar6 = cVar1;
    }
    cVar1 = "xyzc"[lVar2];
    cVar9 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar9 = cVar1;
    }
    if (cVar6 != cVar9) goto LAB_0013e1a1;
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  lVar2 = 4;
LAB_0013e1a1:
  if (cVar6 == cVar9 || (int)lVar2 == 4) {
    CImg(__return_storage_ptr__,this,false);
  }
  else {
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "xycz"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013e22c;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013e22c:
    if ((cVar6 == cVar9 || (int)lVar2 == 4) &&
       (assign(&res,this->_width,this->_height,this->_spectrum,this->_depth),
       0 < (int)this->_spectrum)) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar4 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar7 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar10 = 0;
              do {
                if (0 < (int)this->_width) {
                  iVar11 = 0;
                  do {
                    uVar5 = *puVar15;
                    puVar15 = puVar15 + 1;
                    res._data[lVar2 * lVar4 +
                              (res._8_8_ & 0xffffffff) * lVar2 * lVar7 +
                              (ulong)(res._width * iVar10 + iVar11)] = uVar5;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_width);
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < (int)this->_height);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < (int)this->_depth);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < (int)this->_spectrum);
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "xzyc"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013e32c;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013e32c:
    if ((cVar6 == cVar9 || (int)lVar2 == 4) &&
       (assign(&res,this->_width,this->_depth,this->_height,this->_spectrum),
       0 < (int)this->_spectrum)) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar4 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar10 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar7 = 0;
              do {
                if (0 < (int)this->_width) {
                  iVar11 = 0;
                  do {
                    uVar5 = *puVar15;
                    puVar15 = puVar15 + 1;
                    res._data[(res._8_8_ & 0xffffffff) * lVar2 * lVar4 +
                              lVar2 * lVar7 + (ulong)(res._width * iVar10 + iVar11)] = uVar5;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_width);
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < (int)this->_height);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < (int)this->_depth);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < (int)this->_spectrum);
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "xzcy"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013e436;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013e436:
    if ((cVar6 == cVar9 || (int)lVar2 == 4) &&
       (assign(&res,this->_width,this->_depth,this->_spectrum,this->_height),
       0 < (int)this->_spectrum)) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar4 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar10 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar7 = 0;
              do {
                if (0 < (int)this->_width) {
                  iVar11 = 0;
                  do {
                    uVar5 = *puVar15;
                    puVar15 = puVar15 + 1;
                    res._data[lVar2 * lVar4 +
                              (res._8_8_ & 0xffffffff) * lVar2 * lVar7 +
                              (ulong)(res._width * iVar10 + iVar11)] = uVar5;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_width);
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < (int)this->_height);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < (int)this->_depth);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < (int)this->_spectrum);
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "xcyz"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013e540;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013e540:
    if ((cVar6 == cVar9 || (int)lVar2 == 4) &&
       (assign(&res,this->_width,this->_spectrum,this->_height,this->_depth),
       0 < (int)this->_spectrum)) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar4 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar7 = 0;
              do {
                if (0 < (int)this->_width) {
                  iVar11 = 0;
                  do {
                    uVar5 = *puVar15;
                    puVar15 = puVar15 + 1;
                    res._data[(res._8_8_ & 0xffffffff) * lVar2 * lVar4 +
                              lVar2 * lVar7 + (ulong)(res._width * iVar10 + iVar11)] = uVar5;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_width);
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < (int)this->_height);
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "xczy"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013e647;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013e647:
    if ((cVar6 == cVar9 || (int)lVar2 == 4) &&
       (assign(&res,this->_width,this->_spectrum,this->_depth,this->_height),
       0 < (int)this->_spectrum)) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar4 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar7 = 0;
              do {
                if (0 < (int)this->_width) {
                  iVar11 = 0;
                  do {
                    uVar5 = *puVar15;
                    puVar15 = puVar15 + 1;
                    res._data[lVar2 * lVar4 +
                              (res._8_8_ & 0xffffffff) * lVar2 * lVar7 +
                              (ulong)(res._width * iVar10 + iVar11)] = uVar5;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_width);
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < (int)this->_height);
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "yxzc"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013e74e;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013e74e:
    if ((cVar6 == cVar9 || (int)lVar2 == 4) &&
       (assign(&res,this->_height,this->_width,this->_depth,this->_spectrum),
       0 < (int)this->_spectrum)) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar4 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar7 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar10 = 0;
              do {
                if (0 < (int)this->_width) {
                  iVar11 = 0;
                  do {
                    uVar5 = *puVar15;
                    puVar15 = puVar15 + 1;
                    res._data[lVar2 * lVar7 +
                              (res._8_8_ & 0xffffffff) * lVar2 * lVar4 +
                              (ulong)(res._width * iVar11 + iVar10)] = uVar5;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_width);
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < (int)this->_height);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < (int)this->_depth);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < (int)this->_spectrum);
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "yxcz"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013e856;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013e856:
    if ((cVar6 == cVar9 || (int)lVar2 == 4) &&
       (assign(&res,this->_height,this->_width,this->_spectrum,this->_depth),
       0 < (int)this->_spectrum)) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar4 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar7 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar10 = 0;
              do {
                if (0 < (int)this->_width) {
                  iVar11 = 0;
                  do {
                    uVar5 = *puVar15;
                    puVar15 = puVar15 + 1;
                    res._data[lVar2 * lVar4 +
                              (res._8_8_ & 0xffffffff) * lVar2 * lVar7 +
                              (ulong)(res._width * iVar11 + iVar10)] = uVar5;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_width);
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < (int)this->_height);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < (int)this->_depth);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < (int)this->_spectrum);
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "yzxc"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013e961;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013e961:
    if ((cVar6 == cVar9 || (int)lVar2 == 4) &&
       (assign(&res,this->_height,this->_depth,this->_width,this->_spectrum),
       0 < (int)this->_spectrum)) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar4 = 0;
      lVar7 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar10 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar11 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar12 = 0;
                  lVar16 = 0;
                  lVar14 = (long)res._data + lVar4;
                  do {
                    *(uint *)(lVar14 + (ulong)(res._width * iVar10 + iVar11) * 4) = puVar15[lVar16];
                    lVar16 = lVar16 + 1;
                    lVar14 = lVar14 + lVar2 * 4;
                    lVar12 = lVar12 + 4;
                  } while (lVar16 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar12);
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 < (int)this->_height);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < (int)this->_depth);
        }
        lVar7 = lVar7 + 1;
        lVar4 = lVar4 + (res._8_8_ & 0xffffffff) * lVar2 * 4;
      } while (lVar7 < (int)this->_spectrum);
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "yzcx"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013ea6c;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013ea6c:
    if (cVar6 == cVar9 || (int)lVar2 == 4) {
      assign(&res,this->_height,this->_depth,this->_spectrum,this->_width);
      switch(this->_width) {
      case 1:
        iVar10 = this->_depth * this->_height * this->_spectrum;
        if (iVar10 != 0) {
          lVar2 = 0;
          do {
            uVar5 = *puVar15;
            puVar15 = puVar15 + 1;
            res._data[lVar2] = uVar5;
            lVar2 = lVar2 + 1;
          } while (iVar10 != (int)lVar2);
        }
        break;
      case 2:
        iVar10 = this->_depth * this->_height * this->_spectrum;
        if (iVar10 != 0) {
          lVar2 = 0;
          do {
            res._data[lVar2] = *puVar15;
            puVar8 = puVar15 + 1;
            puVar15 = puVar15 + 2;
            res._data[(ulong)(res._height * res._width * res._depth) + lVar2] = *puVar8;
            lVar2 = lVar2 + 1;
          } while (iVar10 != (int)lVar2);
        }
        break;
      case 3:
        iVar10 = this->_depth * this->_height * this->_spectrum;
        if (iVar10 != 0) {
          uVar5 = res._height * res._width * res._depth;
          lVar2 = 0;
          do {
            res._data[lVar2] = *puVar15;
            res._data[(ulong)uVar5 + lVar2] = puVar15[1];
            puVar8 = puVar15 + 2;
            puVar15 = puVar15 + 3;
            res._data[(ulong)(uVar5 * 2) + lVar2] = *puVar8;
            lVar2 = lVar2 + 1;
          } while (iVar10 != (int)lVar2);
        }
        break;
      case 4:
        iVar10 = this->_depth * this->_height * this->_spectrum;
        if (iVar10 != 0) {
          uVar5 = res._height * res._width * res._depth;
          lVar2 = 0;
          do {
            res._data[lVar2] = *puVar15;
            res._data[(ulong)uVar5 + lVar2] = puVar15[1];
            res._data[(ulong)(uVar5 * 2) + lVar2] = puVar15[2];
            puVar8 = puVar15 + 3;
            puVar15 = puVar15 + 4;
            res._data[(ulong)(uVar5 * 3) + lVar2] = *puVar8;
            lVar2 = lVar2 + 1;
          } while (iVar10 != (int)lVar2);
        }
        break;
      default:
        if (0 < (int)this->_spectrum) {
          lVar2 = (ulong)res._height * (res._0_8_ & 0xffffffff);
          lVar4 = 0;
          lVar7 = 0;
          do {
            if (0 < (int)this->_depth) {
              iVar10 = 0;
              do {
                if (0 < (int)this->_height) {
                  iVar11 = 0;
                  do {
                    if (0 < (int)this->_width) {
                      lVar12 = 0;
                      lVar16 = 0;
                      lVar14 = (long)res._data + lVar4;
                      do {
                        *(uint *)(lVar14 + (ulong)(res._width * iVar10 + iVar11) * 4) =
                             puVar15[lVar16];
                        lVar16 = lVar16 + 1;
                        lVar14 = lVar14 + (res._8_8_ & 0xffffffff) * lVar2 * 4;
                        lVar12 = lVar12 + 4;
                      } while (lVar16 < (int)this->_width);
                      puVar15 = (uint *)((long)puVar15 + lVar12);
                    }
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_height);
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < (int)this->_depth);
            }
            lVar7 = lVar7 + 1;
            lVar4 = lVar4 + lVar2 * 4;
          } while (lVar7 < (int)this->_spectrum);
        }
        CImg(__return_storage_ptr__,&res);
        goto LAB_0013fcaa;
      }
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "ycxz"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013ec48;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013ec48:
    if ((cVar6 == cVar9 || (int)lVar2 == 4) &&
       (assign(&res,this->_height,this->_spectrum,this->_width,this->_depth),
       0 < (int)this->_spectrum)) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar4 = 0;
          lVar7 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar11 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar12 = 0;
                  lVar16 = 0;
                  lVar14 = (long)res._data + lVar4;
                  do {
                    *(uint *)(lVar14 + (ulong)(res._width * iVar10 + iVar11) * 4) = puVar15[lVar16];
                    lVar16 = lVar16 + 1;
                    lVar14 = lVar14 + lVar2 * 4;
                    lVar12 = lVar12 + 4;
                  } while (lVar16 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar12);
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 < (int)this->_height);
            }
            lVar7 = lVar7 + 1;
            lVar4 = lVar4 + (res._8_8_ & 0xffffffff) * lVar2 * 4;
          } while (lVar7 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "yczx"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013ed53;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013ed53:
    if ((cVar6 == cVar9 || (int)lVar2 == 4) &&
       (assign(&res,this->_height,this->_spectrum,this->_depth,this->_width),
       0 < (int)this->_spectrum)) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar4 = 0;
          lVar7 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar11 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar12 = 0;
                  lVar16 = 0;
                  lVar14 = (long)res._data + lVar4;
                  do {
                    *(uint *)(lVar14 + (ulong)(res._width * iVar10 + iVar11) * 4) = puVar15[lVar16];
                    lVar16 = lVar16 + 1;
                    lVar14 = lVar14 + (res._8_8_ & 0xffffffff) * lVar2 * 4;
                    lVar12 = lVar12 + 4;
                  } while (lVar16 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar12);
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 < (int)this->_height);
            }
            lVar7 = lVar7 + 1;
            lVar4 = lVar4 + lVar2 * 4;
          } while (lVar7 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "zxyc"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013ee62;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013ee62:
    if ((cVar6 == cVar9 || (int)lVar2 == 4) &&
       (assign(&res,this->_depth,this->_width,this->_height,this->_spectrum),
       0 < (int)this->_spectrum)) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar4 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar10 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar7 = 0;
              do {
                if (0 < (int)this->_width) {
                  iVar11 = 0;
                  do {
                    uVar5 = *puVar15;
                    puVar15 = puVar15 + 1;
                    res._data[(res._8_8_ & 0xffffffff) * lVar2 * lVar4 +
                              lVar2 * lVar7 + (ulong)(res._width * iVar11 + iVar10)] = uVar5;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_width);
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < (int)this->_height);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < (int)this->_depth);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < (int)this->_spectrum);
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "zxcy"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013ef6c;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013ef6c:
    if ((cVar6 == cVar9 || (int)lVar2 == 4) &&
       (assign(&res,this->_depth,this->_width,this->_spectrum,this->_height),
       0 < (int)this->_spectrum)) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar4 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar10 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar7 = 0;
              do {
                if (0 < (int)this->_width) {
                  iVar11 = 0;
                  do {
                    uVar5 = *puVar15;
                    puVar15 = puVar15 + 1;
                    res._data[lVar2 * lVar4 +
                              (res._8_8_ & 0xffffffff) * lVar2 * lVar7 +
                              (ulong)(res._width * iVar11 + iVar10)] = uVar5;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_width);
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < (int)this->_height);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < (int)this->_depth);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < (int)this->_spectrum);
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "zyxc"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013f076;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013f076:
    if ((cVar6 == cVar9 || (int)lVar2 == 4) &&
       (assign(&res,this->_depth,this->_height,this->_width,this->_spectrum),
       0 < (int)this->_spectrum)) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar4 = 0;
      lVar7 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar10 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar11 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar12 = 0;
                  lVar16 = 0;
                  lVar14 = (long)res._data + lVar4;
                  do {
                    *(uint *)(lVar14 + (ulong)(res._width * iVar11 + iVar10) * 4) = puVar15[lVar16];
                    lVar16 = lVar16 + 1;
                    lVar14 = lVar14 + lVar2 * 4;
                    lVar12 = lVar12 + 4;
                  } while (lVar16 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar12);
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 < (int)this->_height);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < (int)this->_depth);
        }
        lVar7 = lVar7 + 1;
        lVar4 = lVar4 + (res._8_8_ & 0xffffffff) * lVar2 * 4;
      } while (lVar7 < (int)this->_spectrum);
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "zycx"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013f181;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013f181:
    if ((cVar6 == cVar9 || (int)lVar2 == 4) &&
       (assign(&res,this->_depth,this->_height,this->_spectrum,this->_width),
       0 < (int)this->_spectrum)) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar4 = 0;
      lVar7 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar10 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar11 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar12 = 0;
                  lVar16 = 0;
                  lVar14 = (long)res._data + lVar4;
                  do {
                    *(uint *)(lVar14 + (ulong)(res._width * iVar11 + iVar10) * 4) = puVar15[lVar16];
                    lVar16 = lVar16 + 1;
                    lVar14 = lVar14 + (res._8_8_ & 0xffffffff) * lVar2 * 4;
                    lVar12 = lVar12 + 4;
                  } while (lVar16 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar12);
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 < (int)this->_height);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < (int)this->_depth);
        }
        lVar7 = lVar7 + 1;
        lVar4 = lVar4 + lVar2 * 4;
      } while (lVar7 < (int)this->_spectrum);
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "zcxy"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013f290;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013f290:
    if ((cVar6 == cVar9 || (int)lVar2 == 4) &&
       (assign(&res,this->_depth,this->_spectrum,this->_width,this->_height),
       0 < (int)this->_spectrum)) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar11 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar4 = 0;
              puVar8 = res._data;
              do {
                if (0 < (int)this->_width) {
                  lVar7 = 0;
                  lVar14 = 0;
                  puVar3 = puVar8;
                  do {
                    puVar3[res._width * iVar10 + iVar11] = puVar15[lVar14];
                    lVar14 = lVar14 + 1;
                    puVar3 = puVar3 + lVar2;
                    lVar7 = lVar7 + 4;
                  } while (lVar14 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar7);
                }
                lVar4 = lVar4 + 1;
                puVar8 = puVar8 + (res._8_8_ & 0xffffffff) * lVar2;
              } while (lVar4 < (int)this->_height);
            }
            iVar11 = iVar11 + 1;
          } while (iVar11 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "zcyx"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013f397;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013f397:
    if ((cVar6 == cVar9 || (int)lVar2 == 4) &&
       (assign(&res,this->_depth,this->_spectrum,this->_height,this->_width),
       0 < (int)this->_spectrum)) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar11 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar4 = 0;
              puVar8 = res._data;
              do {
                if (0 < (int)this->_width) {
                  lVar7 = 0;
                  lVar14 = 0;
                  puVar3 = puVar8;
                  do {
                    puVar3[res._width * iVar10 + iVar11] = puVar15[lVar14];
                    lVar14 = lVar14 + 1;
                    puVar3 = puVar3 + (res._8_8_ & 0xffffffff) * lVar2;
                    lVar7 = lVar7 + 4;
                  } while (lVar14 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar7);
                }
                lVar4 = lVar4 + 1;
                puVar8 = puVar8 + lVar2;
              } while (lVar4 < (int)this->_height);
            }
            iVar11 = iVar11 + 1;
          } while (iVar11 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "cxyz"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013f4a2;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013f4a2:
    if (cVar6 == cVar9 || (int)lVar2 == 4) {
      assign(&res,this->_spectrum,this->_width,this->_height,this->_depth);
      switch(this->_spectrum) {
      case 1:
        iVar10 = this->_height * this->_width * this->_depth;
        if (iVar10 != 0) {
          puVar8 = this->_data;
          lVar2 = 0;
          do {
            res._data[lVar2] = puVar8[lVar2];
            lVar2 = lVar2 + 1;
          } while (iVar10 != (int)lVar2);
        }
        break;
      case 2:
        uVar5 = this->_height * this->_width * this->_depth;
        if (uVar5 != 0) {
          puVar8 = this->_data;
          lVar2 = 0;
          do {
            res._data[lVar2 * 2] = puVar8[lVar2];
            res._data[lVar2 * 2 + 1] = puVar8[(ulong)uVar5 + lVar2];
            lVar2 = lVar2 + 1;
          } while (uVar5 != (uint)lVar2);
        }
        break;
      case 3:
        uVar5 = this->_height * this->_width * this->_depth;
        if (uVar5 != 0) {
          puVar8 = this->_data;
          lVar2 = 0;
          puVar3 = res._data;
          do {
            *puVar3 = puVar8[lVar2];
            puVar3[1] = puVar8[(ulong)uVar5 + lVar2];
            puVar3[2] = puVar8[(ulong)(uVar5 * 2) + lVar2];
            lVar2 = lVar2 + 1;
            puVar3 = puVar3 + 3;
          } while (uVar5 != (uint)lVar2);
        }
        break;
      case 4:
        uVar5 = this->_height * this->_width * this->_depth;
        if (uVar5 != 0) {
          puVar8 = this->_data;
          lVar2 = 0;
          puVar3 = res._data;
          do {
            *puVar3 = puVar8[lVar2];
            puVar3[1] = puVar8[(ulong)uVar5 + lVar2];
            puVar3[2] = puVar8[(ulong)(uVar5 * 2) + lVar2];
            puVar3[3] = puVar8[(ulong)(uVar5 * 3) + lVar2];
            lVar2 = lVar2 + 1;
            puVar3 = puVar3 + 4;
          } while (uVar5 != (uint)lVar2);
        }
        break;
      default:
        if (0 < (int)this->_spectrum) {
          lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
          iVar10 = 0;
          do {
            if (0 < (int)this->_depth) {
              lVar4 = 0;
              do {
                if (0 < (int)this->_height) {
                  lVar7 = 0;
                  do {
                    if (0 < (int)this->_width) {
                      iVar11 = 0;
                      do {
                        uVar5 = *puVar15;
                        puVar15 = puVar15 + 1;
                        res._data[(res._8_8_ & 0xffffffff) * lVar2 * lVar4 +
                                  lVar2 * lVar7 + (ulong)(res._width * iVar11 + iVar10)] = uVar5;
                        iVar11 = iVar11 + 1;
                      } while (iVar11 < (int)this->_width);
                    }
                    lVar7 = lVar7 + 1;
                  } while (lVar7 < (int)this->_height);
                }
                lVar4 = lVar4 + 1;
              } while (lVar4 < (int)this->_depth);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < (int)this->_spectrum);
        }
      }
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "cxzy"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013f7aa;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013f7aa:
    if ((cVar6 == cVar9 || (int)lVar2 == 4) &&
       (assign(&res,this->_spectrum,this->_width,this->_depth,this->_height),
       0 < (int)this->_spectrum)) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar4 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar7 = 0;
              do {
                if (0 < (int)this->_width) {
                  iVar11 = 0;
                  do {
                    uVar5 = *puVar15;
                    puVar15 = puVar15 + 1;
                    res._data[lVar2 * lVar4 +
                              (res._8_8_ & 0xffffffff) * lVar2 * lVar7 +
                              (ulong)(res._width * iVar11 + iVar10)] = uVar5;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_width);
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < (int)this->_height);
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "cyxz"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013f8af;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013f8af:
    if ((cVar6 == cVar9 || (int)lVar2 == 4) &&
       (assign(&res,this->_spectrum,this->_height,this->_width,this->_depth),
       0 < (int)this->_spectrum)) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar4 = 0;
          lVar7 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar11 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar12 = 0;
                  lVar16 = 0;
                  lVar14 = (long)res._data + lVar4;
                  do {
                    *(uint *)(lVar14 + (ulong)(res._width * iVar11 + iVar10) * 4) = puVar15[lVar16];
                    lVar16 = lVar16 + 1;
                    lVar14 = lVar14 + lVar2 * 4;
                    lVar12 = lVar12 + 4;
                  } while (lVar16 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar12);
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 < (int)this->_height);
            }
            lVar7 = lVar7 + 1;
            lVar4 = lVar4 + (res._8_8_ & 0xffffffff) * lVar2 * 4;
          } while (lVar7 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "cyzx"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013f9ba;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013f9ba:
    if ((cVar6 == cVar9 || (int)lVar2 == 4) &&
       (assign(&res,this->_spectrum,this->_height,this->_depth,this->_width),
       0 < (int)this->_spectrum)) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar4 = 0;
          lVar7 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar11 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar12 = 0;
                  lVar16 = 0;
                  lVar14 = (long)res._data + lVar4;
                  do {
                    *(uint *)(lVar14 + (ulong)(res._width * iVar11 + iVar10) * 4) = puVar15[lVar16];
                    lVar16 = lVar16 + 1;
                    lVar14 = lVar14 + (res._8_8_ & 0xffffffff) * lVar2 * 4;
                    lVar12 = lVar12 + 4;
                  } while (lVar16 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar12);
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 < (int)this->_height);
            }
            lVar7 = lVar7 + 1;
            lVar4 = lVar4 + lVar2 * 4;
          } while (lVar7 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "czxy"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013fac9;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013fac9:
    if ((cVar6 == cVar9 || (int)lVar2 == 4) &&
       (assign(&res,this->_spectrum,this->_depth,this->_width,this->_height),
       0 < (int)this->_spectrum)) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar11 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar4 = 0;
              puVar8 = res._data;
              do {
                if (0 < (int)this->_width) {
                  lVar7 = 0;
                  lVar14 = 0;
                  puVar3 = puVar8;
                  do {
                    puVar3[res._width * iVar11 + iVar10] = puVar15[lVar14];
                    lVar14 = lVar14 + 1;
                    puVar3 = puVar3 + lVar2;
                    lVar7 = lVar7 + 4;
                  } while (lVar14 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar7);
                }
                lVar4 = lVar4 + 1;
                puVar8 = puVar8 + (res._8_8_ & 0xffffffff) * lVar2;
              } while (lVar4 < (int)this->_height);
            }
            iVar11 = iVar11 + 1;
          } while (iVar11 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    lVar2 = 0;
    do {
      cVar1 = permut[lVar2];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "czyx"[lVar2];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013fbd0;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 4);
    lVar2 = 4;
LAB_0013fbd0:
    if ((cVar6 == cVar9 || (int)lVar2 == 4) &&
       (assign(&res,this->_spectrum,this->_depth,this->_height,this->_width),
       0 < (int)this->_spectrum)) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar11 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar4 = 0;
              puVar8 = res._data;
              do {
                if (0 < (int)this->_width) {
                  lVar7 = 0;
                  lVar14 = 0;
                  puVar3 = puVar8;
                  do {
                    puVar3[res._width * iVar11 + iVar10] = puVar15[lVar14];
                    lVar14 = lVar14 + 1;
                    puVar3 = puVar3 + (res._8_8_ & 0xffffffff) * lVar2;
                    lVar7 = lVar7 + 4;
                  } while (lVar14 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar7);
                }
                lVar4 = lVar4 + 1;
                puVar8 = puVar8 + lVar2;
              } while (lVar4 < (int)this->_height);
            }
            iVar11 = iVar11 + 1;
          } while (iVar11 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    if (res._data == (uint *)0x0) {
      this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
      pcVar13 = "non-";
      if (this->_is_shared != false) {
        pcVar13 = "";
      }
      CImgArgumentException::CImgArgumentException
                (this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::permute_axes() : Invalid specified permutation \'%s\'."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar13,"unsigned int",permut);
      __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
    }
    CImg(__return_storage_ptr__,&res);
  }
LAB_0013fcaa:
  if ((res._is_shared == false) && (res._data != (uint *)0x0)) {
    operator_delete__(res._data);
  }
  return __return_storage_ptr__;
}

Assistant:

CImg<t> _get_permute_axes(const char *const permut, const t&) const {
      if (is_empty() || !permut) return CImg<t>(*this,false);
      CImg<t> res;
      const T* ptrs = _data;
      if (!cimg::strncasecmp(permut,"xyzc",4)) return (+*this);
      if (!cimg::strncasecmp(permut,"xycz",4)) {
        res.assign(_width,_height,_spectrum,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(x,y,c,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xzyc",4)) {
        res.assign(_width,_depth,_height,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(x,z,y,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xzcy",4)) {
        res.assign(_width,_depth,_spectrum,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(x,z,c,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xcyz",4)) {
        res.assign(_width,_spectrum,_height,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(x,c,y,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xczy",4)) {
        res.assign(_width,_spectrum,_depth,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(x,c,z,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yxzc",4)) {
        res.assign(_height,_width,_depth,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(y,x,z,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yxcz",4)) {
        res.assign(_height,_width,_spectrum,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(y,x,c,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yzxc",4)) {
        res.assign(_height,_depth,_width,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(y,z,x,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yzcx",4)) {
        res.assign(_height,_depth,_spectrum,_width);
        switch (_width) {
        case 1 : {
          t *ptr_r = res.data(0,0,0,0);
          for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
            *(ptr_r++) = (t)*(ptrs++);
          }
        } break;
        case 2 : {
          t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1);
          for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
            *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++);
          }
        } break;
        case 3 : { // Optimization for the classical conversion from interleaved RGB to planar RGB
          t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2);
          for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
            *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++); *(ptr_b++) = (t)*(ptrs++);
          }
        } break;
        case 4 : { // Optimization for the classical conversion from interleaved RGBA to planar RGBA
          t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2), *ptr_a = res.data(0,0,0,3);
          for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
            *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++); *(ptr_b++) = (t)*(ptrs++); *(ptr_a++) = (t)*(ptrs++);
          }
        } break;
        default : {
          const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,z,c,x,wh,whd) = *(ptrs++);
          return res;
        }
        }
      }
      if (!cimg::strncasecmp(permut,"ycxz",4)) {
        res.assign(_height,_spectrum,_width,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(y,c,x,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yczx",4)) {
        res.assign(_height,_spectrum,_depth,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(y,c,z,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zxyc",4)) {
        res.assign(_depth,_width,_height,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,x,y,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zxcy",4)) {
        res.assign(_depth,_width,_spectrum,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,x,c,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zyxc",4)) {
        res.assign(_depth,_height,_width,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,y,x,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zycx",4)) {
        res.assign(_depth,_height,_spectrum,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,y,c,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zcxy",4)) {
        res.assign(_depth,_spectrum,_width,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,c,x,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zcyx",4)) {
        res.assign(_depth,_spectrum,_height,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,c,y,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cxyz",4)) {
        res.assign(_spectrum,_width,_height,_depth);
        switch (_spectrum) {
        case 1 : {
          const T *ptr_r = data(0,0,0,0);
          t *ptrd = res._data;
          for (unsigned int siz = _width*_height*_depth; siz; --siz) {
            *(ptrd++) = (t)*(ptr_r++);
          }
        } break;
        case 2 : {
          const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1);
          t *ptrd = res._data;
          for (unsigned int siz = _width*_height*_depth; siz; --siz) {
            *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++);
          }
        } break;
        case 3 : { // Optimization for the classical conversion from planar RGB to interleaved RGB
          const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
          t *ptrd = res._data;
          for (unsigned int siz = _width*_height*_depth; siz; --siz) {
            *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++); *(ptrd++) = (t)*(ptr_b++);
          }
        } break;
        case 4 : { // Optimization for the classical conversion from planar RGBA to interleaved RGBA
          const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2), *ptr_a = data(0,0,0,3);
          t *ptrd = res._data;
          for (unsigned int siz = _width*_height*_depth; siz; --siz) {
            *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++); *(ptrd++) = (t)*(ptr_b++); *(ptrd++) = (t)*(ptr_a++);
          }
        } break;
        default : {
          const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,x,y,z,wh,whd) = (t)*(ptrs++);
        }
        }
      }
      if (!cimg::strncasecmp(permut,"cxzy",4)) {
        res.assign(_spectrum,_width,_depth,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(c,x,z,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cyxz",4)) {
        res.assign(_spectrum,_height,_width,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(c,y,x,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cyzx",4)) {
        res.assign(_spectrum,_height,_depth,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(c,y,z,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"czxy",4)) {
        res.assign(_spectrum,_depth,_width,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(c,z,x,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"czyx",4)) {
        res.assign(_spectrum,_depth,_height,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(c,z,y,x,wh,whd) = (t)*(ptrs++);
      }
      if (!res)
        throw CImgArgumentException(_cimg_instance
                                    "permute_axes() : Invalid specified permutation '%s'.",
                                    cimg_instance,
                                    permut);
      return res;
    }